

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Constraints.cpp
# Opt level: O3

bool __thiscall
slang::ast::ConstraintExprVisitor::visit<slang::ast::NewClassExpression>
          (ConstraintExprVisitor *this,NewClassExpression *expr)

{
  int iVar1;
  Expression *pEVar2;
  variant_alternative_t<0UL,_variant<const_SubroutineSymbol_*,_SystemCallInfo>_> pSVar3;
  size_type sVar4;
  long lVar5;
  Type *pTVar6;
  bool bVar7;
  RandMode RVar8;
  ExpressionKind EVar9;
  SubroutineKind SVar10;
  Symbol *symbol;
  variant_alternative_t<0UL,_variant<const_SubroutineSymbol_*,_SystemCallInfo>_> *ppSVar11;
  Diagnostic *diag;
  SourceLocation SVar12;
  long lVar14;
  DiagCode code;
  ASTContext *this_00;
  SourceRange sourceRange;
  DistVarVisitor distVisitor;
  anon_union_8_2_628a4eb3_for_SVIntStorage_0 local_30;
  uint local_28;
  byte local_23;
  SourceLocation SVar13;
  
  if (this->failed != false) goto LAB_00258005;
  if (((this->isSoft == true) &&
      (symbol = Expression::getSymbolReference(&expr->super_Expression,true),
      symbol != (Symbol *)0x0)) &&
     (RVar8 = ASTContext::getRandMode(this->context,symbol), RVar8 == RandC)) {
    ASTContext::addDiag(this->context,(DiagCode)0x340008,(expr->super_Expression).sourceRange);
  }
  EVar9 = (expr->super_Expression).kind;
  if (((Call < EVar9) || ((0x340000U >> (EVar9 & OpenRange) & 1) == 0)) &&
     (pEVar2 = expr->constructorCall_, pEVar2 != (Expression *)0x0)) {
    Expression::visitExpression<slang::ast::Expression_const,slang::ast::ConstraintExprVisitor&>
              (pEVar2,pEVar2,this);
    EVar9 = (expr->super_Expression).kind;
  }
  bVar7 = true;
  if (0x14 < (int)EVar9) {
    switch(EVar9) {
    case OpenRange:
      goto switchD_00257ece_caseD_1f;
    case Dist:
      local_30 = (anon_union_8_2_628a4eb3_for_SVIntStorage_0)this->context;
      local_28 = local_28 & 0xffffff00;
      pEVar2 = *(Expression **)&expr->isSuperClass;
      Expression::visitExpression<slang::ast::Expression_const,slang::ast::DistVarVisitor&>
                (pEVar2,pEVar2,(DistVarVisitor *)&local_30);
      if ((char)local_28 != '\0') {
        return true;
      }
      ASTContext::addDiag(this->context,(DiagCode)0x370008,pEVar2->sourceRange);
      return true;
    case NewArray:
    case NewClass:
    case CopyClass:
      goto switchD_00257ece_caseD_21;
    case NewCovergroup:
      break;
    default:
      if (EVar9 == Call) {
        SVar10 = CallExpression::getSubroutineKind((CallExpression *)expr);
        if (SVar10 == Task) {
          this_00 = this->context;
          SVar13 = (expr->super_Expression).sourceRange.startLoc;
          SVar12 = (expr->super_Expression).sourceRange.endLoc;
          code.subsystem = Statements;
          code.code = 0x44;
          goto LAB_00257ffc;
        }
        if (*(char *)&expr[1].super_Expression.sourceRange.startLoc != '\x01') {
          ppSVar11 = std::
                     get<0ul,slang::ast::SubroutineSymbol_const*,slang::ast::CallExpression::SystemCallInfo>
                               ((variant<const_slang::ast::SubroutineSymbol_*,_slang::ast::CallExpression::SystemCallInfo>
                                 *)&expr->isSuperClass);
          pSVar3 = *ppSVar11;
          if ((pSVar3->super_Scope).deferredMemberIndex != Invalid) {
            Scope::elaborate(&pSVar3->super_Scope);
          }
          sVar4 = (pSVar3->arguments).size_;
          if (sVar4 != 0) {
            lVar14 = 0;
            do {
              lVar5 = *(long *)((long)(pSVar3->arguments).data_ + lVar14);
              iVar1 = *(int *)(lVar5 + 0x90);
              if (iVar1 == 3) {
                if ((*(byte *)(lVar5 + 0x8c) & 1) == 0) goto LAB_002580be;
              }
              else if (iVar1 == 1) {
LAB_002580be:
                this_00 = this->context;
                SVar13 = (expr->super_Expression).sourceRange.startLoc;
                SVar12 = (expr->super_Expression).sourceRange.endLoc;
                code.subsystem = Statements;
                code.code = 0x2d;
                goto LAB_00257ffc;
              }
              lVar14 = lVar14 + 8;
            } while (sVar4 << 3 != lVar14);
          }
        }
      }
    }
    goto switchD_00257e9d_caseD_5;
  }
  switch(EVar9) {
  case IntegerLiteral:
    SVInt::SVInt((SVInt *)&local_30,(SVIntStorage *)&expr->constructorCall_);
    goto LAB_00257f97;
  case RealLiteral:
  case TimeLiteral:
    this_00 = this->context;
    SVar13 = (expr->super_Expression).sourceRange.startLoc;
    SVar12 = (expr->super_Expression).sourceRange.endLoc;
    code.subsystem = Statements;
    code.code = 0x2a;
    break;
  case UnbasedUnsizedIntegerLiteral:
    UnbasedUnsizedIntegerLiteral::getValue((UnbasedUnsizedIntegerLiteral *)&local_30);
LAB_00257f97:
    if ((0x40 < local_28 || (local_23 & 1) != 0) && ((void *)local_30.val != (void *)0x0)) {
      operator_delete__(local_30.pVal);
    }
    if ((local_23 & 1) == 0) {
      return true;
    }
    this_00 = this->context;
    SVar13 = (expr->super_Expression).sourceRange.startLoc;
    SVar12 = (expr->super_Expression).sourceRange.endLoc;
    code.subsystem = Statements;
    code.code = 0x49;
    break;
  case NullLiteral:
  case UnboundedLiteral:
  case StringLiteral:
  case NamedValue:
  case HierarchicalValue:
  case UnaryOp:
    goto switchD_00257e9d_caseD_5;
  case BinaryOp:
    if ((0x12 < *(uint *)&expr->isSuperClass) ||
       ((0x61800U >> (*(uint *)&expr->isSuperClass & 0x1f) & 1) == 0))
    goto switchD_00257e9d_caseD_5;
switchD_00257ece_caseD_21:
    this_00 = this->context;
    SVar13 = (expr->super_Expression).sourceRange.startLoc;
    SVar12 = (expr->super_Expression).sourceRange.endLoc;
    code.subsystem = Statements;
    code.code = 0x13;
    break;
  default:
    if (EVar9 == Streaming) goto switchD_00257ece_caseD_21;
switchD_00257e9d_caseD_5:
    pTVar6 = (expr->super_Expression).type.ptr;
    if (pTVar6 == (Type *)0x0) {
LAB_002580d3:
      assert::assertFailed
                ("ptr",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/../include/slang/util/NotNull.h"
                 ,0x26,
                 "T slang::not_null<const slang::ast::Type *>::get() const [T = const slang::ast::Type *]"
                );
    }
    bVar7 = Type::isValidForRand(pTVar6,Rand);
    if (bVar7) {
      return true;
    }
    diag = ASTContext::addDiag(this->context,(DiagCode)0x290008,(expr->super_Expression).sourceRange
                              );
    pTVar6 = (expr->super_Expression).type.ptr;
    if (pTVar6 == (Type *)0x0) goto LAB_002580d3;
    ast::operator<<(diag,pTVar6);
    goto LAB_00258001;
  }
LAB_00257ffc:
  sourceRange.endLoc = SVar12;
  sourceRange.startLoc = SVar13;
  ASTContext::addDiag(this_00,code,sourceRange);
LAB_00258001:
  this->failed = true;
LAB_00258005:
  bVar7 = false;
switchD_00257ece_caseD_1f:
  return bVar7;
}

Assistant:

bool visit(const T& expr) {
        if (failed)
            return false;

        if constexpr (std::is_base_of_v<Expression, T>) {
            if (isSoft) {
                if (auto sym = expr.getSymbolReference()) {
                    RandMode mode = context.getRandMode(*sym);
                    if (mode == RandMode::RandC)
                        context.addDiag(diag::RandCInSoft, expr.sourceRange);
                }
            }

            if constexpr (is_detected_v<ASTDetectors::visitExprs_t, T, ConstraintExprVisitor>) {
                // Inside call and select expressions we don't care about the types.
                // This allows things like selections of associative arrays and built-in methods
                // on arrays of strings to work as long as the actual operators at the top level
                // don't have those types.
                if (expr.kind != ExpressionKind::ElementSelect &&
                    expr.kind != ExpressionKind::MemberAccess &&
                    expr.kind != ExpressionKind::Call) {
                    expr.visitExprs(*this);
                }
            }

            switch (expr.kind) {
                case ExpressionKind::Streaming:
                case ExpressionKind::NewArray:
                case ExpressionKind::NewClass:
                case ExpressionKind::CopyClass:
                    context.addDiag(diag::ExprNotConstraint, expr.sourceRange);
                    return visitInvalid(expr);
                case ExpressionKind::RealLiteral:
                case ExpressionKind::TimeLiteral:
                    context.addDiag(diag::NonIntegralConstraintLiteral, expr.sourceRange);
                    return visitInvalid(expr);
                case ExpressionKind::IntegerLiteral:
                    if (expr.template as<IntegerLiteral>().getValue().hasUnknown()) {
                        context.addDiag(diag::UnknownConstraintLiteral, expr.sourceRange);
                        return visitInvalid(expr);
                    }
                    return true;
                case ExpressionKind::UnbasedUnsizedIntegerLiteral:
                    if (expr.template as<UnbasedUnsizedIntegerLiteral>().getValue().hasUnknown()) {
                        context.addDiag(diag::UnknownConstraintLiteral, expr.sourceRange);
                        return visitInvalid(expr);
                    }
                    return true;
                case ExpressionKind::BinaryOp: {
                    switch (expr.template as<BinaryExpression>().op) {
                        case BinaryOperator::CaseEquality:
                        case BinaryOperator::CaseInequality:
                        case BinaryOperator::WildcardEquality:
                        case BinaryOperator::WildcardInequality:
                            context.addDiag(diag::ExprNotConstraint, expr.sourceRange);
                            return visitInvalid(expr);
                        default:
                            break;
                    }
                    break;
                }
                case ExpressionKind::OpenRange:
                    return true;
                case ExpressionKind::Dist: {
                    // Additional restrictions on dist expressions:
                    // - must contain at least one 'rand' var
                    // - cannot contain any 'randc' vars
                    DistVarVisitor distVisitor(context);
                    auto& left = expr.template as<DistExpression>().left();
                    left.visit(distVisitor);
                    if (!distVisitor.anyRandVars)
                        context.addDiag(diag::RandNeededInDist, left.sourceRange);
                    return true;
                }
                case ExpressionKind::Call: {
                    auto& call = expr.template as<CallExpression>();
                    if (call.getSubroutineKind() == SubroutineKind::Task) {
                        context.addDiag(diag::TaskInConstraint, expr.sourceRange);
                        return visitInvalid(expr);
                    }

                    if (!call.isSystemCall()) {
                        const SubroutineSymbol& sub = *std::get<0>(call.subroutine);
                        for (auto arg : sub.getArguments()) {
                            if (arg->direction == ArgumentDirection::Out ||
                                (arg->direction == ArgumentDirection::Ref &&
                                 !arg->flags.has(VariableFlags::Const))) {
                                context.addDiag(diag::OutRefFuncConstraint, expr.sourceRange);
                                return visitInvalid(expr);
                            }
                        }
                    }
                    break;
                }
                default:
                    break;
            }

            if (!expr.type->isValidForRand(RandMode::Rand)) {
                context.addDiag(diag::NonIntegralConstraintExpr, expr.sourceRange) << *expr.type;
                return visitInvalid(expr);
            }
        }

        return true;
    }